

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

bool __thiscall
QTransposeProxyModel::moveColumns
          (QTransposeProxyModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  parameter_type pQVar3;
  arrow_operator_result ppQVar4;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  uint in_R9D;
  long in_FS_OFFSET;
  QTransposeProxyModelPrivate *d;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTransposeProxyModel *)0x8b4097);
  pQVar3 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b40ad);
  if (pQVar3 == (parameter_type)0x0) {
    local_39 = false;
  }
  else {
    ppQVar4 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
              ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                            *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    pQVar1 = *ppQVar4;
    (**(code **)(*in_RDI + 400))(local_20,in_RDI,in_RSI);
    (**(code **)(*in_RDI + 400))(local_38,in_RDI,in_R8);
    iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0x23])
                      (pQVar1,local_20,(ulong)in_EDX,(ulong)in_ECX,local_38,(ulong)in_R9D);
    local_39 = (bool)((byte)iVar2 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QTransposeProxyModel::moveColumns(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    Q_D(QTransposeProxyModel);
    Q_ASSERT(checkIndex(sourceParent));
    Q_ASSERT(checkIndex(destinationParent));
    if (!d->model)
        return false;
    return d->model->moveRows(mapToSource(sourceParent), sourceRow, count, mapToSource(destinationParent), destinationChild);
}